

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::setupWeights(SPxSteepPR<double> *this,Type type)

{
  VectorBase<double> *this_00;
  VectorBase<double> *this_01;
  int iVar1;
  SPxSolverBase<double> *pSVar2;
  SVSetBase<double> *pSVar3;
  bool bVar4;
  SPxOut *pSVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  Verbosity old_verbosity;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_90;
  SSVectorBase<double> local_80;
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  this_00 = &pSVar2->weights;
  this_01 = &pSVar2->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      if (pSVar2->weightsAreSetup == false) {
        iVar10 = (pSVar2->thecovectors->set).thenum;
        lVar12 = 0;
        lVar6 = 0;
      }
      else {
        iVar10 = (pSVar2->thecovectors->set).thenum;
        iVar7 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pSVar2->coWeights).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
        if (iVar10 < iVar7) {
          iVar7 = iVar10;
        }
        iVar1 = (pSVar2->thevectors->set).thenum;
        iVar9 = (int)((ulong)((long)(pSVar2->weights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pSVar2->weights).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
        if (iVar1 < iVar9) {
          iVar9 = iVar1;
        }
        lVar6 = (long)iVar7;
        lVar12 = (long)iVar9;
      }
      VectorBase<double>::reDim(this_01,iVar10,false);
      pSVar2 = (this->super_SPxPricer<double>).thesolver;
      for (lVar8 = (long)(pSVar2->thecovectors->set).thenum; lVar6 < lVar8; lVar8 = lVar8 + -1) {
        (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8 + -1] = 2.0;
      }
      VectorBase<double>::reDim(this_00,(pSVar2->thevectors->set).thenum,false);
      for (lVar6 = (long)(((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum;
          lVar12 < lVar6; lVar6 = lVar6 + -1) {
        (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6 + -1] = 1.0;
      }
    }
    else {
      if (pSVar2->weightsAreSetup == false) {
        iVar10 = (pSVar2->thecovectors->set).thenum;
        lVar12 = 0;
      }
      else {
        iVar10 = (pSVar2->thecovectors->set).thenum;
        iVar7 = (int)((ulong)((long)(pSVar2->coWeights).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pSVar2->coWeights).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3);
        if (iVar10 < iVar7) {
          iVar7 = iVar10;
        }
        lVar12 = (long)iVar7;
      }
      VectorBase<double>::reDim(this_01,iVar10,false);
      for (lVar6 = (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
          lVar12 < lVar6; lVar6 = lVar6 + -1) {
        (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6 + -1] = 1.0;
      }
    }
  }
  else {
    pSVar5 = pSVar2->spxout;
    if ((pSVar5 != (SPxOut *)0x0) && (2 < (int)pSVar5->m_verbosity)) {
      local_80.super_IdxSet._vptr_IdxSet._0_4_ = pSVar5->m_verbosity;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<(((this->super_SPxPricer<double>).thesolver)->spxout,
                                  " --- initializing steepest edge multipliers");
      std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
      pSVar5 = ((this->super_SPxPricer<double>).thesolver)->spxout;
      (*pSVar5->_vptr_SPxOut[2])(pSVar5,&local_80);
    }
    VectorBase<double>::reDim
              (this_01,(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum,false
              );
    if (type == ENTER) {
      pSVar2 = (this->super_SPxPricer<double>).thesolver;
      for (uVar11 = (ulong)(uint)(pSVar2->thecovectors->set).thenum; 0 < (int)uVar11;
          uVar11 = uVar11 - 1) {
        (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11 - 1] = 1.0;
      }
      VectorBase<double>::reDim(this_00,(pSVar2->thevectors->set).thenum,false);
      for (uVar11 = (ulong)(uint)(((this->super_SPxPricer<double>).thesolver)->thevectors->set).
                                 thenum; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        pSVar3 = ((this->super_SPxPricer<double>).thesolver)->thevectors;
        dVar13 = SVectorBase<double>::length2
                           ((SVectorBase<double> *)
                            ((pSVar3->set).theitem + (pSVar3->set).thekey[uVar11 - 1].idx));
        (this_00->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11 - 1] = dVar13 + 1.0;
      }
    }
    else {
      pSVar2 = (this->super_SPxPricer<double>).thesolver;
      iVar10 = (pSVar2->thecovectors->set).thenum;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 &(pSVar2->super_SPxLPBase<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      SSVectorBase<double>::SSVectorBase
                (&local_80,iVar10,(shared_ptr<soplex::Tolerances> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      uVar11 = (ulong)(uint)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
      lVar12 = uVar11 << 5;
      for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        bVar4 = SPxSolverBase<double>::isTimeLimitReached
                          ((this->super_SPxPricer<double>).thesolver,false);
        if (bVar4) break;
        pSVar2 = (this->super_SPxPricer<double>).thesolver;
        SPxBasisBase<double>::coSolve
                  (&pSVar2->super_SPxBasisBase<double>,&local_80,
                   (SVectorBase<double> *)
                   ((long)&(pSVar2->unitVecs).data.
                           super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].super_SVectorBase<double>.
                           m_elem + lVar12));
        dVar13 = SSVectorBase<double>::length2(&local_80);
        (this_01->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11 - 1] = dVar13;
        lVar12 = lVar12 + -0x20;
      }
      SSVectorBase<double>::~SSVectorBase(&local_80);
    }
  }
  ((this->super_SPxPricer<double>).thesolver)->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}